

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

void player_scramble_stats(player *p)

{
  uint32_t *puVar1;
  int16_t iVar2;
  int16_t iVar3;
  int16_t iVar4;
  ushort uVar5;
  ushort uVar6;
  uint32_t uVar7;
  uint m;
  ulong uVar8;
  
  uVar8 = 5;
  while( true ) {
    m = (int)uVar8 - 1;
    uVar8 = (ulong)m;
    uVar7 = Rand_div(m);
    iVar2 = p->stat_max[uVar8];
    iVar3 = p->stat_cur[uVar8];
    iVar4 = p->stat_cur[(int)uVar7];
    p->stat_max[uVar8] = p->stat_max[(int)uVar7];
    p->stat_cur[uVar8] = iVar4;
    p->stat_max[(int)uVar7] = iVar2;
    p->stat_cur[(int)uVar7] = iVar3;
    uVar5 = p->stat_map[uVar8];
    if (4 < uVar5) {
      __assert_fail("swap >= 0 && swap < STAT_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-util.c"
                    ,0x1f6,"void player_scramble_stats(struct player *)");
    }
    uVar6 = p->stat_map[(int)uVar7];
    p->stat_map[uVar8] = uVar6;
    if (4 < uVar6) break;
    p->stat_map[(int)uVar7] = uVar5;
    if (m < 2) {
      puVar1 = &p->upkeep->update;
      *puVar1 = *puVar1 | 1;
      return;
    }
  }
  __assert_fail("p->stat_map[i] >= 0 && p->stat_map[i] < STAT_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-util.c"
                ,0x1f8,"void player_scramble_stats(struct player *)");
}

Assistant:

void player_scramble_stats(struct player *p)
{
	int max1, cur1, max2, cur2, i, j, swap;

	/* Fisher-Yates shuffling algorithm */
	for (i = STAT_MAX - 1; i > 0; --i) {
		j = randint0(i);

		max1 = p->stat_max[i];
		cur1 = p->stat_cur[i];
		max2 = p->stat_max[j];
		cur2 = p->stat_cur[j];

		p->stat_max[i] = max2;
		p->stat_cur[i] = cur2;
		p->stat_max[j] = max1;
		p->stat_cur[j] = cur1;

		/* Record what we did */
		swap = p->stat_map[i];
		assert(swap >= 0 && swap < STAT_MAX);
		p->stat_map[i] = p->stat_map[j];
		assert(p->stat_map[i] >= 0 && p->stat_map[i] < STAT_MAX);
		p->stat_map[j] = swap;
	}

	/* Mark what else needs to be updated */
	p->upkeep->update |= (PU_BONUS);
}